

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

Thread * __thiscall GEO::SmartPointer<GEO::Thread>::operator->(SmartPointer<GEO::Thread> *this)

{
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  if (this->pointer_ != (Thread *)0x0) {
    return this->pointer_;
  }
  std::__cxx11::string::string((string *)&local_28,"pointer_ != nullptr",&local_49);
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
             ,&local_4a);
  geo_assertion_failed(&local_28,&local_48,0x482);
}

Assistant:

T* operator-> () const {
            geo_assert(pointer_ != nullptr);
            return pointer_;
        }